

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void mnf::utils::hat2(Matrix3d *M,Vector3d *v)

{
  double dVar1;
  CoeffReturnType pdVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar3;
  double local_90;
  double local_88 [3];
  double local_70;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_68;
  double local_48;
  double v2_2;
  double v1_2;
  double v0_2;
  double v2v0;
  double v1v2;
  double v0v1;
  Vector3d *v_local;
  Matrix3d *M_local;
  
  v0v1 = (double)v;
  v_local = (Vector3d *)M;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v,0);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,1);
  v1v2 = dVar1 * *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,1);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,2);
  v2v0 = dVar1 * *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,2);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,0);
  v0_2 = dVar1 * *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,0);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,0);
  v1_2 = dVar1 * *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,1);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,1);
  v2_2 = dVar1 * *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,2);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)v0v1,2);
  local_48 = dVar1 * *pdVar2;
  local_70 = -v2_2 - local_48;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)v_local,&local_70);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_68,&v1v2);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&v0_2);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&v1v2);
  local_88[0] = -v1_2 - local_48;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,local_88);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&v2v0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&v0_2);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&v2v0);
  local_90 = -v1_2 - v2_2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_90);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_68);
  return;
}

Assistant:

void hat2(Eigen::Matrix3d& M, const Eigen::Vector3d& v)
{
  double v0v1 = v(0) * v(1);
  double v1v2 = v(1) * v(2);
  double v2v0 = v(2) * v(0);
  double v0_2 = v(0) * v(0);
  double v1_2 = v(1) * v(1);
  double v2_2 = v(2) * v(2);

  M << -v1_2 - v2_2, v0v1, v2v0, v0v1, -v0_2 - v2_2, v1v2, v2v0, v1v2,
      -v0_2 - v1_2;
}